

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void nn_hash_init(nn_hash *self)

{
  void *pvVar1;
  undefined4 *in_RDI;
  uint32_t i;
  uint local_c;
  
  *in_RDI = 0x20;
  in_RDI[1] = 0;
  pvVar1 = nn_alloc_(0x1e1bfa);
  *(void **)(in_RDI + 2) = pvVar1;
  if (*(long *)(in_RDI + 2) == 0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/utils/hash.c"
            ,0x29);
    fflush(_stderr);
    nn_err_abort();
  }
  for (local_c = 0; local_c != 0x20; local_c = local_c + 1) {
    nn_list_init((nn_list *)(*(long *)(in_RDI + 2) + (ulong)local_c * 0x10));
  }
  return;
}

Assistant:

void nn_hash_init (struct nn_hash *self)
{
    uint32_t i;

    self->slots = NN_HASH_INITIAL_SLOTS;
    self->items = 0;
    self->array = nn_alloc (sizeof (struct nn_list) * NN_HASH_INITIAL_SLOTS,
        "hash map");
    alloc_assert (self->array);
    for (i = 0; i != NN_HASH_INITIAL_SLOTS; ++i)
        nn_list_init (&self->array [i]);
}